

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_set.cpp
# Opt level: O2

bool std::operator==(set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *s,
                    initializer_list<unsigned_int> *l)

{
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_const_unsigned_int_*> pVar1;
  _Rb_tree_header *p_Var2;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_const_unsigned_int_*> pVar3;
  
  p_Var2 = &(s->_M_t)._M_impl.super__Rb_tree_header;
  pVar3 = __mismatch<std::_Rb_tree_const_iterator<unsigned_int>,unsigned_int_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    ((s->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,p_Var2,l->_M_array,
                     l->_M_array + l->_M_len);
  pVar1.second = l->_M_array + l->_M_len;
  pVar1.first._M_node = &p_Var2->_M_header;
  return pVar3 == pVar1;
}

Assistant:

bool operator == (const std::set<T, C, A> & s, const Coll & l)
    {
        return std::mismatch(s.begin(), s.end(), l.begin(), l.end()) == std::make_pair(s.end(), l.end());
    }